

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# manifest_parser_test.cc
# Opt level: O0

void __thiscall
ParserTestDuplicateRuleInDifferentSubninjasWithInclude::
~ParserTestDuplicateRuleInDifferentSubninjasWithInclude
          (ParserTestDuplicateRuleInDifferentSubninjasWithInclude *this)

{
  ParserTestDuplicateRuleInDifferentSubninjasWithInclude *this_local;
  
  ~ParserTestDuplicateRuleInDifferentSubninjasWithInclude(this);
  operator_delete(this,0x1e8);
  return;
}

Assistant:

TEST_F(ParserTest, DuplicateRuleInDifferentSubninjasWithInclude) {
  // Test that rules are scoped to subninjas even with includes.
  fs_.Create("rules.ninja", "rule cat\n"
                         "  command = cat\n");
  fs_.Create("test.ninja", "include rules.ninja\n"
                         "build x : cat\n");
  ManifestParser parser(&state, &fs_);
  string err;
  EXPECT_TRUE(parser.ParseTest("include rules.ninja\n"
                                "subninja test.ninja\n"
                                "build y : cat\n", &err));
}